

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall anon_func::Mapper::~Mapper(Mapper *this)

{
  _Manager_type p_Var1;
  pointer pTVar2;
  
  (this->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).super_Pass.
  _vptr_Pass = (_func_int **)&PTR__Mapper_01070db0;
  p_Var1 = (this->work).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->work,(_Any_data *)&this->work,__destroy_functor);
  }
  pTVar2 = (this->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).
           super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
           super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_std::allocator<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>
                                          ).super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                                          super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.
                                          flexible.
                                          super__Vector_base<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_std::allocator<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar2);
  }
  ::wasm::Pass::~Pass((Pass *)this);
  operator_delete(this,0x160);
  return;
}

Assistant:

bool modifiesBinaryenIR() override { return Mut; }